

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O3

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>::~sc_signal_t
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1> *this,void **vtt)

{
  int *piVar1;
  sc_process_b *this_00;
  
  this_00 = (this->super_sc_writer_policy_check<(sc_core::sc_writer_policy)1>).
            super_sc_writer_policy_check_delta.super_sc_writer_policy_check_write.m_writer_p.
            m_target_p;
  if (this_00 != (sc_process_b *)0x0) {
    piVar1 = &this_00->m_references_n;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      sc_process_b::delete_process(this_00);
    }
  }
  sc_signal_channel::~sc_signal_channel(&this->super_sc_signal_channel);
  return;
}

Assistant:

virtual ~sc_signal_t() {}